

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

int Spl_ManLutFanouts(Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,
                     Vec_Bit_t *vMarksCIO)

{
  int iVar1;
  int *piVar2;
  byte bVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  if (-1 < iObj) {
    if (iObj < p->vMapping2->nSize) {
      if (p->vMapping2->pArray[(uint)iObj].nSize == 0) {
        __assert_fail("Gia_ObjIsLut2(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x10f,
                      "int Spl_ManLutFanouts(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Bit_t *)"
                     );
      }
      vFanouts->nSize = 0;
      pVVar4 = p->vFanoutNums;
      if (iObj < pVVar4->nSize) {
        iVar7 = 0;
        while( true ) {
          if (pVVar4->pArray[(uint)iObj] <= iVar7) {
            iVar7 = vFanouts->nSize;
            if (0 < iVar7) {
              piVar2 = vFanouts->pArray;
              lVar6 = 0;
              do {
                uVar5 = piVar2[lVar6];
                if (((int)uVar5 < 0) || (vMarksCIO->nSize <= (int)uVar5)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                }
                bVar3 = (byte)uVar5 & 0x1f;
                vMarksCIO->pArray[uVar5 >> 5] =
                     vMarksCIO->pArray[uVar5 >> 5] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
                lVar6 = lVar6 + 1;
                iVar7 = vFanouts->nSize;
              } while (lVar6 < iVar7);
            }
            return iVar7;
          }
          iVar1 = p->vFanout->nSize;
          if (iVar1 <= iObj) break;
          piVar2 = p->vFanout->pArray;
          uVar5 = piVar2[(uint)iObj] + iVar7;
          if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) break;
          Spl_ManLutFanouts_rec(p,piVar2[uVar5],vFanouts,vMarksNo,vMarksCIO);
          iVar7 = iVar7 + 1;
          pVVar4 = p->vFanoutNums;
          if (pVVar4->nSize <= iObj) break;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Spl_ManLutFanouts( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int i, iFanout;
    assert( Gia_ObjIsLut2(p, iObj) );
    Vec_IntClear( vFanouts );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
    // clean up
    Vec_IntForEachEntry( vFanouts, iFanout, i )
        Vec_BitWriteEntry( vMarksCIO, iFanout, 0 );
    return Vec_IntSize(vFanouts);
}